

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void __thiscall Board::RenderHeader(Board *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"*************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"* ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1," *");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"*************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->board_subtitle);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Board::RenderHeader() {
  std::cout << "*************" << std::endl;
  std::cout << "* " << board_title << " *" << std::endl;
  std::cout << "*************" << std::endl;
  std::cout << board_subtitle << std::endl;
}